

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeClearObject(sqlite3 *db,Vdbe *p)

{
  sqlite3 *in_RSI;
  SubProgram *pNext;
  SubProgram *pSub;
  void *in_stack_ffffffffffffffd8;
  sqlite3 *db_00;
  int nOp;
  undefined1 *p_00;
  sqlite3 *aOp;
  
  p_00 = &DAT_aaaaaaaaaaaaaaaa;
  db_00 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  if (*(long *)(in_RSI->aLimit + 4) != 0) {
    releaseMemArray((Mem *)in_RSI,-0x55555556);
    sqlite3DbNNFreeNN(in_RSI,p_00);
  }
  aOp = (sqlite3 *)in_RSI->pRollbackArg;
  while (nOp = (int)((ulong)db_00 >> 0x20), aOp != (sqlite3 *)0x0) {
    db_00 = *(sqlite3 **)&aOp->nDb;
    vdbeFreeOpArray(in_RSI,(Op *)aOp,(int)((ulong)db_00 >> 0x20));
    sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
    aOp = db_00;
  }
  if ((in_RSI->init).field_0x7 != '\0') {
    releaseMemArray((Mem *)in_RSI,0);
    if (*(long *)(in_RSI->aLimit + 10) != 0) {
      sqlite3DbNNFreeNN(in_RSI,aOp);
    }
    if (in_RSI->xProfile != (_func_void_void_ptr_char_ptr_u64 *)0x0) {
      sqlite3DbNNFreeNN(in_RSI,aOp);
    }
  }
  vdbeFreeOpArray(in_RSI,(Op *)aOp,nOp);
  if (in_RSI->pTraceArg != (void *)0x0) {
    sqlite3DbNNFreeNN(in_RSI,aOp);
  }
  return;
}

Assistant:

static void sqlite3VdbeClearObject(sqlite3 *db, Vdbe *p){
  SubProgram *pSub, *pNext;
  assert( db!=0 );
  assert( p->db==0 || p->db==db );
  if( p->aColName ){
    releaseMemArray(p->aColName, p->nResAlloc*COLNAME_N);
    sqlite3DbNNFreeNN(db, p->aColName);
  }
  for(pSub=p->pProgram; pSub; pSub=pNext){
    pNext = pSub->pNext;
    vdbeFreeOpArray(db, pSub->aOp, pSub->nOp);
    sqlite3DbFree(db, pSub);
  }
  if( p->eVdbeState!=VDBE_INIT_STATE ){
    releaseMemArray(p->aVar, p->nVar);
    if( p->pVList ) sqlite3DbNNFreeNN(db, p->pVList);
    if( p->pFree ) sqlite3DbNNFreeNN(db, p->pFree);
  }
  vdbeFreeOpArray(db, p->aOp, p->nOp);
  if( p->zSql ) sqlite3DbNNFreeNN(db, p->zSql);
#ifdef SQLITE_ENABLE_NORMALIZE
  sqlite3DbFree(db, p->zNormSql);
  {
    DblquoteStr *pThis, *pNxt;
    for(pThis=p->pDblStr; pThis; pThis=pNxt){
      pNxt = pThis->pNextStr;
      sqlite3DbFree(db, pThis);
    }
  }
#endif
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  {
    int i;
    for(i=0; i<p->nScan; i++){
      sqlite3DbFree(db, p->aScan[i].zName);
    }
    sqlite3DbFree(db, p->aScan);
  }
#endif
}